

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O1

shared_ptr<chrono::ChLinkLockRevolute> __thiscall
chrono::curiosity::AddRevoluteJoint
          (curiosity *this,shared_ptr<chrono::ChBodyAuxRef> *body_1,
          shared_ptr<chrono::ChBodyAuxRef> *body_2,
          shared_ptr<chrono::curiosity::CuriosityChassis> *chassis,ChVector<double> *rel_joint_pos,
          ChQuaternion<double> *rel_joint_rot)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long *plVar4;
  ChFrame<double> *this_00;
  ChLinkLockRevolute *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<chrono::ChLinkLockRevolute> sVar6;
  ChFrame<double> X_GC;
  ChFrame<double> X_PC;
  undefined8 local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  element_type *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  element_type *local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_190;
  shared_ptr<chrono::curiosity::CuriosityChassis> *local_188;
  shared_ptr<chrono::ChBodyAuxRef> *local_180;
  ChFrame<double> local_178;
  double local_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double dStack_c8;
  double dStack_c0;
  ChFrame<double> local_b8;
  
  peVar1 = (chassis->
           super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar2 = (peVar1->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (peVar1->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_188 = chassis;
  local_180 = body_2;
  this_00 = (ChFrame<double> *)(**(code **)(*(long *)peVar2 + 0x1f0))();
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  local_b8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
  local_b8.coord.pos.m_data[0] = rel_joint_pos->m_data[0];
  local_b8.coord.pos.m_data[1] = rel_joint_pos->m_data[1];
  local_b8.coord.pos.m_data[2] = rel_joint_pos->m_data[2];
  local_b8.coord.rot.m_data[0] = rel_joint_rot->m_data[0];
  local_b8.coord.rot.m_data[1] = rel_joint_rot->m_data[1];
  local_b8.coord.rot.m_data[2] = rel_joint_rot->m_data[2];
  local_b8.coord.rot.m_data[3] = rel_joint_rot->m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_b8.Amatrix,rel_joint_rot);
  ChFrame<double>::operator*(&local_178,this_00,&local_b8);
  this_01 = (ChLinkLockRevolute *)ChLinkLock::operator_new((ChLinkLock *)0xe90,(size_t)this_00);
  ChLinkLockRevolute::ChLinkLockRevolute(this_01);
  *(ChLinkLockRevolute **)this = this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChLinkLockRevolute*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),this_01);
  plVar4 = *(long **)this;
  local_198 = (body_1->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_190 = (body_1->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
  if (local_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_190->_M_use_count = local_190->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_190->_M_use_count = local_190->_M_use_count + 1;
    }
  }
  local_1a8 = (local_180->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
  local_1a0 = (local_180->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
  if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_1a0->_M_use_count = local_1a0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_1a0->_M_use_count = local_1a0->_M_use_count + 1;
    }
  }
  local_f0 = local_178.coord.pos.m_data[0];
  local_e8 = local_178.coord.pos.m_data[1];
  dStack_e0 = local_178.coord.pos.m_data[2];
  local_d8 = local_178.coord.rot.m_data[0];
  dStack_d0 = local_178.coord.rot.m_data[1];
  dStack_c8 = local_178.coord.rot.m_data[2];
  dStack_c0 = local_178.coord.rot.m_data[3];
  (**(code **)(*plVar4 + 0x250))(plVar4,&local_198,&local_1a8);
  if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
  }
  if (local_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190);
  }
  peVar1 = (local_188->
           super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar2 = (peVar1->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (peVar1->super_CuriosityPart).m_body.
           super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  plVar4 = *(long **)(peVar2 + 0x38);
  local_1b8 = *(undefined8 *)this;
  local_1b0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  if (local_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_1b0->_M_use_count = local_1b0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_1b0->_M_use_count = local_1b0->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar4 + 0x138))(plVar4,&local_1b8);
  _Var5._M_pi = extraout_RDX;
  if (local_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b0);
    _Var5._M_pi = extraout_RDX_00;
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    _Var5._M_pi = extraout_RDX_01;
  }
  sVar6.super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var5._M_pi;
  sVar6.super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChLinkLockRevolute>)
         sVar6.super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChLinkLockRevolute> AddRevoluteJoint(std::shared_ptr<ChBodyAuxRef> body_1,
                                                     std::shared_ptr<ChBodyAuxRef> body_2,
                                                     std::shared_ptr<CuriosityChassis> chassis,
                                                     const ChVector<>& rel_joint_pos,
                                                     const ChQuaternion<>& rel_joint_rot) {
    const ChFrame<>& X_GP = chassis->GetBody()->GetFrame_REF_to_abs();  // global -> parent
    ChFrame<> X_PC(rel_joint_pos, rel_joint_rot);                       // parent -> child
    ChFrame<> X_GC = X_GP * X_PC;                                       // global -> child

    auto joint = chrono_types::make_shared<ChLinkLockRevolute>();
    joint->Initialize(body_1, body_2, ChCoordsys<>(X_GC.GetCoord().pos, X_GC.GetCoord().rot));
    chassis->GetBody()->GetSystem()->AddLink(joint);

    return joint;
}